

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O3

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,24ul,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char (*args_s) [24],int *args,int *args_1,int *args_2,
               shared_ptr<Bar> *args_3,shared_ptr<Bar> *args_4,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_5)

{
  undefined8 uVar1;
  AutoLoadVisitor visitor_00;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char *a [6];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL> array;
  long *local_170;
  ulong local_168;
  long local_160 [2];
  int *local_150;
  int *local_148;
  shared_ptr<Bar> *local_140;
  int *local_138;
  AutoLoadVisitor local_130;
  char *local_128 [7];
  undefined8 local_f0 [2];
  undefined1 local_e0 [16];
  long alStack_d0 [20];
  
  local_170 = local_160;
  local_150 = args_1;
  local_148 = args_2;
  local_140 = args_3;
  local_138 = args;
  local_130.ar = visitor.ar;
  sVar3 = strlen(*args_s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,args_s,*args_s + sVar3);
  lVar4 = 0x10;
  do {
    *(undefined1 **)((long)local_128 + lVar4 + 0x28) = (undefined1 *)((long)local_f0 + lVar4);
    *(undefined8 *)((long)local_128 + lVar4 + 0x30) = 0;
    *(undefined1 *)((long)local_f0 + lVar4) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xd0);
  lVar4 = 0;
  uVar6 = 0;
  uVar9 = local_168;
  do {
    plVar8 = local_170;
    uVar7 = uVar6;
    if (uVar6 < uVar9) {
      do {
        iVar2 = isspace((int)*(char *)((long)plVar8 + uVar6));
        uVar7 = uVar6;
        if (iVar2 == 0) break;
        uVar6 = uVar6 + 1;
        uVar7 = uVar9;
      } while (uVar9 != uVar6);
    }
    uVar5 = uVar7;
    for (; (uVar9 = local_168, plVar8 = local_170, uVar5 = uVar5 + 1, uVar7 < local_168 &&
           (*(char *)((long)local_170 + uVar7) != ',')); uVar7 = uVar7 + 1) {
      std::__cxx11::string::push_back((char)local_160 + (char)lVar4 * ' ' + 'p');
    }
    do {
      uVar6 = uVar5;
      if (uVar9 <= uVar6) break;
      iVar2 = isspace((int)*(char *)((long)plVar8 + uVar6));
      uVar5 = uVar6 + 1;
    } while (iVar2 != 0);
    visitor_00.ar = local_130.ar;
    lVar4 = lVar4 + 1;
    if (lVar4 == 6) {
      lVar4 = 0;
      do {
        uVar1 = *(undefined8 *)((long)alStack_d0 + lVar4 * 4);
        *(undefined8 *)((long)local_128 + lVar4) = *(undefined8 *)((long)local_f0 + lVar4 * 4);
        *(undefined8 *)((long)local_128 + lVar4 + 8) = uVar1;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x30);
      serialize::InputArchive::_load_nvp<int>(local_130.ar,local_128[0],local_138);
      accept<miyuki::serialize::AutoLoadVisitor,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
                (visitor_00,local_128 + 1,local_150,local_148,local_140,args_4,args_5);
      lVar4 = -0xc0;
      plVar8 = alStack_d0 + 0x12;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      if (local_170 != local_160) {
        operator_delete(local_170,local_160[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void accept(Visitor visitor, const char (&args_s)[N], Args &... args) {
        std::string s = args_s;
        std::array<std::string, sizeof...(Args)> array;
        size_t pos = 0;
        for (size_t i = 0; i < array.size(); i++) {
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
            while (pos < s.length() && s[pos] != ',')
                array[i] += s[pos++];
            pos++;
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
        }
        const char *a[sizeof...(Args)];
        for (size_t i = 0; i < array.size(); i++) {
            a[i] = array[i].c_str();
        }
        accept<Visitor, Args...>(visitor, a, args...);
    }